

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::Runner::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner *this,RunContext *context,
          TestCaseFilters *filterGroup)

{
  TestCase *pTVar1;
  size_t sVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  IRegistryHub *pIVar8;
  undefined4 extraout_var;
  long *plVar9;
  undefined4 extraout_var_00;
  long lVar10;
  iterator iVar11;
  TestCase *testCase;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  undefined1 *local_98;
  Totals local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  pIVar8 = getRegistryHub();
  iVar6 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar6));
  testCase = (TestCase *)*plVar9;
  pIVar8 = getRegistryHub();
  iVar6 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x10))
                     ((long *)CONCAT44(extraout_var_00,iVar6));
  pTVar1 = *(TestCase **)(lVar10 + 8);
  local_98 = (undefined1 *)(__return_storage_ptr__->assertions).passed;
  if (testCase == pTVar1) {
    bVar5 = true;
  }
  else {
    local_b0 = (__return_storage_ptr__->assertions).failed;
    local_a8 = (__return_storage_ptr__->testCases).passed;
    local_a0 = (__return_storage_ptr__->testCases).failed;
    iVar6 = 0;
    do {
      bVar5 = TestCaseFilters::shouldInclude(filterGroup,testCase);
      if (bVar5) {
        iVar6 = iVar6 + 1;
        iVar11 = std::
                 _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                 ::find(&(this->m_testsAlreadyRun)._M_t,testCase);
        if ((_Rb_tree_header *)iVar11._M_node ==
            &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
          sVar2 = (context->m_totals).assertions.failed;
          iVar7 = (*(((context->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
                    [10])();
          if (sVar2 == (long)iVar7) break;
          RunContext::runTest(&local_70,context,testCase);
          local_98 = (undefined1 *)((long)(size_t *)local_70.assertions.passed + (long)local_98);
          local_b0 = local_b0 + local_70.assertions.failed;
          local_a8 = local_a8 + local_70.testCases.passed;
          local_a0 = local_a0 + local_70.testCases.failed;
          std::
          _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
          ::_M_insert_unique<Catch::TestCase_const&>
                    ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                      *)&this->m_testsAlreadyRun,testCase);
        }
      }
      testCase = testCase + 1;
    } while (testCase != pTVar1);
    (__return_storage_ptr__->assertions).failed = local_b0;
    (__return_storage_ptr__->testCases).passed = local_a8;
    (__return_storage_ptr__->testCases).failed = local_a0;
    bVar5 = iVar6 == 0;
  }
  (__return_storage_ptr__->assertions).passed = (size_t)local_98;
  if (bVar5) {
    pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
    local_70.assertions.passed = (size_t)&local_70.testCases;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
    bVar5 = local_70.assertions.failed != 0;
    if ((Counts *)local_70.assertions.passed != &local_70.testCases) {
      operator_delete((void *)local_70.assertions.passed);
    }
  }
  else {
    bVar5 = false;
  }
  if (bVar5) {
    pIVar4 = (this->m_reporter).m_p;
    pcVar3 = (filterGroup->m_name)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + (filterGroup->m_name)._M_string_length);
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[5])(pIVar4,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( RunContext& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCase>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCase>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 && !filterGroup.getName().empty() )
                m_reporter->noMatchingTestCases( filterGroup.getName() );
            return totals;

        }